

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O0

void SetScroller(int tag,EScroll type,double dx,double dy)

{
  bool bVar1;
  int i_00;
  DScroller *this;
  size_t len;
  FSectorTagIterator local_4c;
  FSectorTagIterator itr;
  int i;
  DScroller *scroller;
  TThinkerIterator<DScroller> iterator;
  double dy_local;
  double dx_local;
  EScroll type_local;
  int tag_local;
  
  iterator.super_FThinkerIterator._16_8_ = dy;
  TThinkerIterator<DScroller>::TThinkerIterator((TThinkerIterator<DScroller> *)&scroller,0x20);
  itr.searchtag = 0;
  while (register0x00000000 =
              TThinkerIterator<DScroller>::Next((TThinkerIterator<DScroller> *)&scroller),
        register0x00000000 != (DScroller *)0x0) {
    bVar1 = DScroller::IsType(register0x00000000,type);
    if (bVar1) {
      i_00 = DScroller::GetAffectee(stack0xffffffffffffffc0);
      bVar1 = FTagManager::SectorHasTag(&tagManager,i_00,tag);
      if (bVar1) {
        itr.searchtag = itr.searchtag + 1;
        DScroller::SetRate(stack0xffffffffffffffc0,dx,(double)iterator.super_FThinkerIterator._16_8_
                          );
      }
    }
  }
  if ((itr.searchtag < 1) &&
     ((((dx != 0.0 || (NAN(dx))) || ((double)iterator.super_FThinkerIterator._16_8_ != 0.0)) ||
      (NAN((double)iterator.super_FThinkerIterator._16_8_))))) {
    len = (size_t)(uint)tag;
    FSectorTagIterator::FSectorTagIterator(&local_4c,tag);
    while (itr.searchtag = FSectorTagIterator::Next(&local_4c), -1 < itr.searchtag) {
      this = (DScroller *)DObject::operator_new((DObject *)0x90,len);
      len = (size_t)type;
      DScroller::DScroller
                (this,type,dx,(double)iterator.super_FThinkerIterator._16_8_,-1,itr.searchtag,0,
                 scw_all);
    }
  }
  return;
}

Assistant:

void SetScroller (int tag, EScroll type, double dx, double dy)
{
	TThinkerIterator<DScroller> iterator (STAT_SCROLLER);
	DScroller *scroller;
	int i;

	// Check if there is already a scroller for this tag
	// If at least one sector with this tag is scrolling, then they all are.
	// If the deltas are both 0, we don't remove the scroller, because a
	// displacement/accelerative scroller might have been set up, and there's
	// no way to create one after the level is fully loaded.
	i = 0;
	while ( (scroller = iterator.Next ()) )
	{
		if (scroller->IsType (type))
		{
			if (tagManager.SectorHasTag(scroller->GetAffectee (), tag))
			{
				i++;
				scroller->SetRate (dx, dy);
			}
		}
	}

	if (i > 0 || (dx == 0 && dy == 0))
	{
		return;
	}

	// Need to create scrollers for the sector(s)
	FSectorTagIterator itr(tag);
	while ((i = itr.Next()) >= 0)
	{
		new DScroller (type, dx, dy, -1, i, 0);
	}
}